

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_exception.cc
# Opt level: O0

void __thiscall ExceptionIDNotFound::ExceptionIDNotFound(ExceptionIDNotFound *this,ID *id)

{
  string *s;
  undefined8 in_RSI;
  Exception *in_RDI;
  string local_68 [8];
  string *in_stack_ffffffffffffffa0;
  Object *in_stack_ffffffffffffffa8;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [32];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  Exception::Exception
            ((Exception *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  *(undefined8 *)&in_RDI[1].msg_ = local_10;
  s = (string *)ID::Name((ID *)0x1579b3);
  strfmt_abi_cxx11_((char *)local_68,"`%s\' undeclared",s);
  Exception::append(in_RDI,s);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

ExceptionIDNotFound::ExceptionIDNotFound(const ID* id) : Exception(id), id_(id)
	{
	append(strfmt("`%s' undeclared", id_->Name()));
	}